

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::handle_prevote_resp(raft_server *this,resp_msg *resp)

{
  atomic<int> *paVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  element_type *peVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  bool bVar11;
  int32 iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  srv_role _role;
  srv_role _role_00;
  Param param;
  bool exp;
  undefined7 uStack_4f;
  
  if ((resp->super_msg_base).term_ == (this->pre_vote_).term_) {
    lVar15 = 0xd8;
    if (resp->accepted_ == false) {
      lVar15 = (ulong)(resp->next_idx_ == 0xffffffffffffffff) * 8 + 0xd4;
    }
    LOCK();
    piVar2 = (int *)((long)&this->_vptr_raft_server + lVar15);
    *piVar2 = *piVar2 + 1;
    UNLOCK();
    iVar12 = get_quorum_for_election(this);
    peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar7 != (element_type *)0x0) {
      iVar13 = (*peVar7->_vptr_logger[7])();
      if (3 < iVar13) {
        peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar3 = (resp->super_msg_base).src_;
        bVar11 = resp->accepted_;
        uVar8 = (this->pre_vote_).term_;
        uVar9 = (resp->super_msg_base).term_;
        srv_role_to_string_abi_cxx11_((string *)&exp,(nuraft *)(ulong)(this->role_)._M_i,_role);
        uVar10 = CONCAT71(uStack_4f,exp);
        uVar4 = (this->pre_vote_).dead_.super___atomic_base<int>._M_i;
        uVar5 = (this->pre_vote_).live_.super___atomic_base<int>._M_i;
        uVar6 = (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i;
        uVar14 = get_num_voting_members(this);
        pcVar16 = "X";
        if (bVar11 != false) {
          pcVar16 = "O";
        }
        msg_if_given_abi_cxx11_
                  ((string *)&param,
                   "[PRE-VOTE RESP] peer %d (%s), term %lu, resp term %lu, my role %s, dead %d, live %d, abandoned %d, num voting members %d, quorum %d\n"
                   ,(ulong)uVar3,pcVar16,uVar8,uVar9,uVar10,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,
                   (ulong)uVar14,(ulong)(iVar12 + 1));
        (*peVar7->_vptr_logger[8])
                  (peVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_prevote_resp",0x1df,&param);
        std::__cxx11::string::~string((string *)&param);
        std::__cxx11::string::~string((string *)&exp);
      }
    }
    if (iVar12 < (this->pre_vote_).dead_.super___atomic_base<int>._M_i) {
      peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar7 != (element_type *)0x0) {
        iVar13 = (*peVar7->_vptr_logger[7])();
        if (3 < iVar13) {
          peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&param,"[PRE-VOTE DONE] SUCCESS, term %lu",(this->pre_vote_).term_);
          (*peVar7->_vptr_logger[8])
                    (peVar7,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_resp",0x1e2,&param);
          std::__cxx11::string::~string((string *)&param);
        }
      }
      exp = false;
      bVar11 = std::atomic<bool>::compare_exchange_strong
                         (&(this->pre_vote_).done_,&exp,true,memory_order_seq_cst);
      peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (bVar11) {
        if (peVar7 != (element_type *)0x0) {
          iVar13 = (*peVar7->_vptr_logger[7])();
          if (3 < iVar13) {
            peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_((string *)&param,"[PRE-VOTE DONE] initiate actual vote");
            (*peVar7->_vptr_logger[8])
                      (peVar7,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"handle_prevote_resp",0x1e7,&param);
            std::__cxx11::string::~string((string *)&param);
          }
        }
        initiate_vote(this,false);
        if ((this->role_)._M_i != leader) {
          restart_election_timer(this);
        }
      }
      else if (peVar7 != (element_type *)0x0) {
        iVar13 = (*peVar7->_vptr_logger[7])();
        if (3 < iVar13) {
          peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&param,"[PRE-VOTE DONE] actual vote is already initiated, do nothing"
                    );
          (*peVar7->_vptr_logger[8])
                    (peVar7,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_resp",0x1f2,&param);
          std::__cxx11::string::~string((string *)&param);
        }
      }
    }
    if (iVar12 < (this->pre_vote_).live_.super___atomic_base<int>._M_i) {
      LOCK();
      paVar1 = &(this->pre_vote_).quorum_reject_count_;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar7 != (element_type *)0x0) {
        iVar13 = (*peVar7->_vptr_logger[7])();
        if (2 < iVar13) {
          peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&param,"[PRE-VOTE] rejected by quorum, count %d",
                     (ulong)(uint)(this->pre_vote_).quorum_reject_count_.super___atomic_base<int>.
                                  _M_i);
          (*peVar7->_vptr_logger[8])
                    (peVar7,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_resp",0x1f9,&param);
          std::__cxx11::string::~string((string *)&param);
        }
      }
      if (raft_limits_ <= (this->pre_vote_).quorum_reject_count_.super___atomic_base<int>._M_i) {
        peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar7 != (element_type *)0x0) {
          iVar13 = (*peVar7->_vptr_logger[7])();
          if (0 < iVar13) {
            peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&param,
                       "too many pre-vote rejections, probably this node is not receiving heartbeat from leader. we should re-establish the network connection"
                      );
            (*peVar7->_vptr_logger[8])
                      (peVar7,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"handle_prevote_resp",0x1fe,&param);
            std::__cxx11::string::~string((string *)&param);
          }
        }
        send_reconnect_request(this);
      }
    }
    if (iVar12 < (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i) {
      peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar7 != (element_type *)0x0) {
        iVar13 = (*peVar7->_vptr_logger[7])();
        if (1 < iVar13) {
          peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&param,"[PRE-VOTE DONE] this node has been removed, stepping down");
          (*peVar7->_vptr_logger[8])
                    (peVar7,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_resp",0x204,&param);
          std::__cxx11::string::~string((string *)&param);
        }
      }
      param.myId = this->id_;
      param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
      param.peerId = -1;
      param.ctx = (void *)0x0;
      cb_func::call(&((this->ctx_)._M_t.
                      super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                      .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                    RemovedFromCluster,&param);
      this->steps_to_down_ = 2;
    }
  }
  else {
    peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar7 != (element_type *)0x0) {
      iVar13 = (*peVar7->_vptr_logger[7])();
      if (3 < iVar13) {
        peVar7 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar3 = (resp->super_msg_base).src_;
        srv_role_to_string_abi_cxx11_((string *)&exp,(nuraft *)(ulong)(this->role_)._M_i,_role_00);
        msg_if_given_abi_cxx11_
                  ((string *)&param,
                   "[PRE-VOTE RESP] from peer %d, my role %s, but different resp term %lu (pre-vote term %lu). ignore it."
                   ,(ulong)uVar3,CONCAT71(uStack_4f,exp),(resp->super_msg_base).term_,
                   (this->pre_vote_).term_);
        (*peVar7->_vptr_logger[8])
                  (peVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_prevote_resp",0x1c4,&param);
        std::__cxx11::string::~string((string *)&param);
        std::__cxx11::string::~string((string *)&exp);
      }
    }
  }
  return;
}

Assistant:

void raft_server::handle_prevote_resp(resp_msg& resp) {
    if (resp.get_term() != pre_vote_.term_) {
        // Vote response for other term. Should ignore it.
        p_in("[PRE-VOTE RESP] from peer %d, my role %s, "
             "but different resp term %" PRIu64 " (pre-vote term %" PRIu64 "). "
             "ignore it.",
             resp.get_src(), srv_role_to_string(role_).c_str(),
             resp.get_term(), pre_vote_.term_);
        return;
    }

    if (resp.get_accepted()) {
        // Accept: means that this peer is not receiving HB.
        pre_vote_.dead_++;
    } else {
        if (resp.get_next_idx() != std::numeric_limits<ulong>::max()) {
            // Deny: means that this peer still sees leader.
            pre_vote_.live_++;
        } else {
            // `next_idx_for_resp == MAX`, it is a special signal
            // indicating that this node has been already removed.
            pre_vote_.abandoned_++;
        }
    }

    int32 election_quorum_size = get_quorum_for_election() + 1;

    p_in("[PRE-VOTE RESP] peer %d (%s), term %" PRIu64 ", resp term %" PRIu64 ", "
         "my role %s, dead %d, live %d, abandoned %d, "
         "num voting members %d, quorum %d\n",
         resp.get_src(), (resp.get_accepted())?"O":"X",
         pre_vote_.term_, resp.get_term(),
         srv_role_to_string(role_).c_str(),
         pre_vote_.dead_.load(), pre_vote_.live_.load(), pre_vote_.abandoned_.load(),
         get_num_voting_members(), election_quorum_size);

    if (pre_vote_.dead_ >= election_quorum_size) {
        p_in("[PRE-VOTE DONE] SUCCESS, term %" PRIu64, pre_vote_.term_);

        bool exp = false;
        bool val = true;
        if (pre_vote_.done_.compare_exchange_strong(exp, val)) {
            p_in("[PRE-VOTE DONE] initiate actual vote");

            // Immediately initiate actual vote.
            initiate_vote();

            // restart the election timer if this is not yet a leader
            if (role_ != srv_role::leader) {
                restart_election_timer();
            }

        } else {
            p_in("[PRE-VOTE DONE] actual vote is already initiated, do nothing");
        }
    }

    if (pre_vote_.live_ >= election_quorum_size) {
        pre_vote_.quorum_reject_count_.fetch_add(1);
        p_wn("[PRE-VOTE] rejected by quorum, count %d",
             pre_vote_.quorum_reject_count_.load());
        if ( pre_vote_.quorum_reject_count_ >=
                 raft_server::raft_limits_.pre_vote_rejection_limit_ ) {
            p_ft("too many pre-vote rejections, probably this node is not "
                 "receiving heartbeat from leader. "
                 "we should re-establish the network connection");
            send_reconnect_request();
        }
    }

    if (pre_vote_.abandoned_ >= election_quorum_size) {
        p_er("[PRE-VOTE DONE] this node has been removed, stepping down");
        cb_func::Param param(id_, leader_);
        CbReturnCode rc = ctx_->cb_func_.call( cb_func::RemovedFromCluster,
                                               &param );
        (void)rc;
        steps_to_down_ = 2;
    }
}